

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# where_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::WhereBinder::BindColumnRef
          (BindResult *__return_storage_ptr__,WhereBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  bool bVar1;
  ColumnAliasBinder *this_00;
  BindResult *pBVar2;
  BindResult result;
  BindResult alias_result;
  BindResult local_140;
  BindResult local_b8;
  
  ExpressionBinder::BindExpression(&local_140,&this->super_ExpressionBinder,expr_ptr,depth,false);
  if ((local_140.error.initialized == true) &&
     ((this->column_alias_binder).ptr != (ColumnAliasBinder *)0x0)) {
    BindResult::BindResult(&local_b8);
    this_00 = optional_ptr<duckdb::ColumnAliasBinder,_true>::operator->(&this->column_alias_binder);
    bVar1 = ColumnAliasBinder::BindAlias
                      (this_00,&this->super_ExpressionBinder,expr_ptr,depth,root_expression,
                       &local_b8);
    pBVar2 = &local_140;
    if (bVar1) {
      pBVar2 = &local_b8;
    }
    BindResult::BindResult(__return_storage_ptr__,pBVar2);
    BindResult::~BindResult(&local_b8);
  }
  else {
    BindResult::BindResult(__return_storage_ptr__,&local_140);
  }
  BindResult::~BindResult(&local_140);
  return __return_storage_ptr__;
}

Assistant:

BindResult WhereBinder::BindColumnRef(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {

	auto result = ExpressionBinder::BindExpression(expr_ptr, depth);
	if (!result.HasError() || !column_alias_binder) {
		return result;
	}

	BindResult alias_result;
	auto found_alias = column_alias_binder->BindAlias(*this, expr_ptr, depth, root_expression, alias_result);
	if (found_alias) {
		return alias_result;
	}

	return result;
}